

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  iterator __lhs;
  bool bVar1;
  __type _Var2;
  reference ppcVar3;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_38;
  cmCursesCacheEntryComposite **local_30;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_28;
  iterator it;
  string *key_local;
  cmCursesMainForm *this_local;
  
  if (this->Entries !=
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    it._M_current = (cmCursesCacheEntryComposite **)key;
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
    ::__normal_iterator(&local_28);
    local_30 = (cmCursesCacheEntryComposite **)
               std::
               vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               ::begin(this->Entries);
    local_28._M_current = local_30;
    while( true ) {
      local_38._M_current =
           (cmCursesCacheEntryComposite **)
           std::
           vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
           end(this->Entries);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      __lhs = it;
      if (!bVar1) break;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_28);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs._M_current,&(*ppcVar3)->Key);
      if (_Var2) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
      ::operator++(&local_28);
    }
  }
  return false;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  if (!this->Entries) {
    return false;
  }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
    if (key == (*it)->Key) {
      return true;
    }
  }

  return false;
}